

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O1

wchar_t char_ptr_Compare(char *left,char *right)

{
  wchar_t wVar1;
  
  wVar1 = L'\x01';
  if (left == (char *)0x0) {
    wVar1 = (uint)(left == (char *)0x0 && right == (char *)0x0) + L'\xffffffff';
  }
  if (left == (char *)0x0 || right == (char *)0x0) {
    return wVar1;
  }
  wVar1 = strcmp(left,right);
  return wVar1;
}

Assistant:

int char_ptr_Compare(const char* left, const char* right)
{
    if ((left == NULL) &&
        (right == NULL))
    {
        return 0;
    }
    else if (left == NULL)
    {
        return -1;
    }
    else if (right == NULL)
    {
        return 1;
    }
    else
    {
        return strcmp(left, right);
    }
}